

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_fromCharCode(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  JSValue JVar4;
  int32_t c;
  StringBuffer local_50;
  
  string_buffer_init(ctx,&local_50,argc);
  uVar2 = 0;
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 * 0x10 == uVar2) {
      JVar4 = string_buffer_end(&local_50);
      return JVar4;
    }
    JVar4.tag = *(int64_t *)((long)&argv->tag + uVar2);
    JVar4.u.ptr = ((JSValueUnion *)((long)&argv->u + uVar2))->ptr;
    iVar1 = JS_ToInt32(ctx,&c,JVar4);
    if ((iVar1 != 0) || (iVar1 = string_buffer_putc16(&local_50,(uint)(ushort)c), iVar1 != 0))
    break;
    uVar2 = uVar2 + 0x10;
  }
  (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_fromCharCode(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    int i;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, argc);

    for(i = 0; i < argc; i++) {
        int32_t c;
        if (JS_ToInt32(ctx, &c, argv[i]) || string_buffer_putc16(b, c & 0xffff)) {
            string_buffer_free(b);
            return JS_EXCEPTION;
        }
    }
    return string_buffer_end(b);
}